

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O0

void Arguments_create_from_string(Arguments *args,char *argstring)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char **ppcVar4;
  bool bVar5;
  int local_28;
  Bool_t is_delim;
  int i;
  Bool_t is_delim_prev;
  size_t len;
  char *argstring_local;
  Arguments *args_local;
  
  if (args == (Arguments *)0x0) {
    __assert_fail("args != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/arguments.c"
                  ,0x3f,"void Arguments_create_from_string(Arguments *, const char *)");
  }
  if (argstring != (char *)0x0) {
    sVar2 = strlen(argstring);
    pcVar3 = (char *)malloc(sVar2 + 1);
    args->argstring = pcVar3;
    memcpy(args->argstring,argstring,sVar2 + 1);
    ppcVar4 = (char **)malloc(sVar2 << 3);
    args->argv_unconsumed = ppcVar4;
    *args->argv_unconsumed = args->argstring + sVar2;
    args->argc = 1;
    bVar1 = true;
    for (local_28 = 0; (ulong)(long)local_28 < sVar2; local_28 = local_28 + 1) {
      if ((args->argstring[local_28] == ' ') || (args->argstring[local_28] == '\t')) {
        args->argstring[local_28] = '\0';
      }
      bVar5 = args->argstring[local_28] == '\0';
      if ((bVar1) && (!bVar5)) {
        args->argv_unconsumed[args->argc] = args->argstring + local_28;
        args->argc = args->argc + 1;
      }
      bVar1 = bVar5;
    }
    return;
  }
  __assert_fail("argstring != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/arguments.c"
                ,0x40,"void Arguments_create_from_string(Arguments *, const char *)");
}

Assistant:

void Arguments_create_from_string( Arguments*  args,
                                   const char* argstring )
{
  Assert( args != NULL );
  Assert( argstring != NULL );

  size_t len = strlen( argstring );

  args->argstring = (char*) malloc( (len+1) * sizeof( char ) );
  memcpy( args->argstring, argstring, len+1 );

  args->argv_unconsumed = (char**) malloc( len * sizeof( char* ) );

  args->argv_unconsumed[0] = & args->argstring[len];
  args->argc = 1;

  /*---Parse string, convert to args---*/
  Bool_t is_delim_prev = Bool_true;
  int i = 0;
  for( i=0; i<len; ++i )
  {
    if( args->argstring[i] == ' ' || args->argstring[i] == '\t' )
    {
      args->argstring[i] = 0;
    }
    Bool_t is_delim = args->argstring[i] == 0;
    if( is_delim_prev && ! is_delim )
    {
      args->argv_unconsumed[args->argc] = & args->argstring[i];
      args->argc++;
    }
    is_delim_prev = is_delim;
  }
}